

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclConfig.cpp
# Opt level: O3

void __thiscall xmrig::OclConfig::OclConfig(OclConfig *this)

{
  _Rb_tree_header *p_Var1;
  
  this->m_cache = true;
  this->m_enabled = false;
  this->m_shouldSave = false;
  (this->m_devicesHint).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_devicesHint).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_devicesHint).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_loader).m_data = (char *)0x0;
  (this->m_loader).m_size = 0;
  String::String(&this->m_platformVendor,"AMD");
  p_Var1 = &(this->m_threads).m_profiles._M_t._M_impl.super__Rb_tree_header;
  (this->m_threads).m_profiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_threads).m_profiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_threads).m_profiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_threads).m_profiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_threads).m_profiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_platformIndex = 0;
  return;
}

Assistant:

xmrig::OclConfig::OclConfig() :
    m_platformVendor(kAMD)
{
}